

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::concat<kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  char *__dest;
  String local_28;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  pcVar1 = (this->text).content.ptr;
  __return_storage_ptr__->size_ = (size_t)pcVar1;
  heapString(&local_28,(size_t)pcVar1);
  pcVar1 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar3 = (__return_storage_ptr__->text).content.disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_28.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_28.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_28.content.disposer;
  local_28.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,0,0,_::HeapArrayDisposer::
                                   Allocate_<kj::StringTree::Branch,_false,_false>::construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_28.content.size_ = 0;
  local_28.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar4 = (__return_storage_ptr__->branches).ptr;
  if (pBVar4 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (*(code *)**(undefined8 **)pAVar3)
              (pAVar3,pBVar4,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_28.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_28.content.size_;
  (__return_storage_ptr__->branches).disposer = local_28.content.disposer;
  pcVar1 = (this->text).content.ptr;
  if (pcVar1 != (char *)0x0) {
    __dest = (char *)(__return_storage_ptr__->text).content.size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->text).content.ptr;
    }
    memcpy(__dest,(void *)this->size_,(size_t)pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}